

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_x509.cc
# Opt level: O0

int X509_print_ex_fp(FILE *bp,X509 *x,ulong nmflag,ulong cflag)

{
  BIO *bp_00;
  int ret;
  BIO *b;
  unsigned_long cflag_local;
  unsigned_long nmflag_local;
  X509 *x_local;
  FILE *fp_local;
  
  bp_00 = BIO_new_fp(bp,0);
  if (bp_00 == (BIO *)0x0) {
    ERR_put_error(0xb,0,7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/t_x509.cc"
                  ,0x21);
    fp_local._4_4_ = 0;
  }
  else {
    fp_local._4_4_ = X509_print_ex(bp_00,x,nmflag,cflag);
    BIO_free(bp_00);
  }
  return fp_local._4_4_;
}

Assistant:

int X509_print_ex_fp(FILE *fp, X509 *x, unsigned long nmflag,
                     unsigned long cflag) {
  BIO *b = BIO_new_fp(fp, BIO_NOCLOSE);
  if (b == NULL) {
    OPENSSL_PUT_ERROR(X509, ERR_R_BUF_LIB);
    return 0;
  }
  int ret = X509_print_ex(b, x, nmflag, cflag);
  BIO_free(b);
  return ret;
}